

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutCase.cpp
# Opt level: O1

TestInstance * __thiscall
vkt::ssbo::SSBOLayoutCase::createInstance(SSBOLayoutCase *this,Context *context)

{
  BufferMode BVar1;
  TestInstance *pTVar2;
  
  pTVar2 = (TestInstance *)operator_new(0x68);
  BVar1 = this->m_bufferMode;
  pTVar2->m_context = context;
  pTVar2->_vptr_TestInstance = (_func_int **)&PTR__SSBOLayoutCaseInstance_00d5f980;
  *(BufferMode *)&pTVar2[1]._vptr_TestInstance = BVar1;
  pTVar2[1].m_context = (Context *)&this->m_interface;
  pTVar2[2]._vptr_TestInstance = (_func_int **)&this->m_refLayout;
  pTVar2[2].m_context = (Context *)&this->m_initialData;
  pTVar2[3]._vptr_TestInstance = (_func_int **)&this->m_writeData;
  pTVar2[5].m_context = (Context *)0x0;
  pTVar2[6]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[4].m_context = (Context *)0x0;
  pTVar2[5]._vptr_TestInstance = (_func_int **)0x0;
  pTVar2[3].m_context = (Context *)0x0;
  pTVar2[4]._vptr_TestInstance = (_func_int **)0x0;
  return pTVar2;
}

Assistant:

TestInstance* SSBOLayoutCase::createInstance (Context& context) const
{
	return new SSBOLayoutCaseInstance(context, m_bufferMode, m_interface, m_refLayout, m_initialData, m_writeData);
}